

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GPUShaderFP64Test10::iterate(GPUShaderFP64Test10 *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  char *description;
  byte bVar2;
  pointer type;
  functionEnum *pfVar3;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (bVar1) {
    testInit(this);
    bVar2 = 1;
    for (type = (this->m_types).
                super__Vector_base<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
                ._M_impl.super__Vector_impl_data._M_start;
        (this->m_types).
        super__Vector_base<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
        ._M_impl.super__Vector_impl_data._M_finish != type; type = type + 1) {
      for (pfVar3 = (this->m_functions).
                    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pfVar3 != (this->m_functions).
                    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pfVar3 = pfVar3 + 1) {
        bVar1 = test(this,*pfVar3,type);
        bVar2 = bVar2 & bVar1;
      }
    }
    if (bVar2 == 0) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,(uint)(bVar2 == 0),description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_ARB_gpu_shader_fp64 is not supported",&local_41);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test10::iterate()
{
	bool result = true;

	/* Check if extension is supported */
	if (false == m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported");
	}

	testInit();

	/* For each combination of function and type */
	for (std::vector<typeDetails>::const_iterator type = m_types.begin(); m_types.end() != type; ++type)
	{
		for (std::vector<functionEnum>::const_iterator function = m_functions.begin(); m_functions.end() != function;
			 ++function)
		{
			if (false == test(*function, *type))
			{
				result = false;
			}
		}
	}

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}